

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
::addArgWithFlagOnly
          (API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *this,Char flag,bool isWithValue,bool isRequired,String *desc,String *longDesc,
          String *defaultValue,String *valueSpecifier)

{
  ulong uVar1;
  pointer pAVar2;
  API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  undefined8 in_stack_00000008;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> a;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> arg;
  pointer in_stack_ffffffffffffff78;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *puVar3;
  Arg *in_stack_ffffffffffffff80;
  AllOfGroup *this_00;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff88;
  ArgPtr *in_stack_ffffffffffffffa8;
  GroupIface *in_stack_ffffffffffffffb0;
  Deleter<Args::ArgIface> local_3d [10];
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  Char in_stack_ffffffffffffffcf;
  Arg *in_stack_ffffffffffffffd0;
  
  operator_new(0xf8);
  Arg::Arg(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,(bool)in_stack_ffffffffffffffce,
           (bool)in_stack_ffffffffffffffcd);
  Deleter<Args::ArgIface>::Deleter(local_3d,true);
  std::unique_ptr<Args::Arg,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x13b982);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x13b99a);
    Arg::setDescription(in_stack_ffffffffffffff80,(String *)in_stack_ffffffffffffff78);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x13b9f8);
    Arg::setLongDescription(in_stack_ffffffffffffff80,(String *)in_stack_ffffffffffffff78);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pAVar2 = std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x13ba24);
    (*(pAVar2->super_ArgIface)._vptr_ArgIface[0x16])(pAVar2,in_stack_00000008);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x13ba5a);
    Arg::setValueSpecifier(in_stack_ffffffffffffff80,(String *)in_stack_ffffffffffffff78);
  }
  puVar3 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
           &stack0xffffffffffffffb0;
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::Arg,Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)in_RDI,
             in_stack_ffffffffffffff88);
  this_00 = in_RDI->m_self;
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00,puVar3);
  GroupIface::addArg(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  return in_RDI;
}

Assistant:

API< PARENT, SELF, ARGPTR, false > & addArgWithFlagOnly(
		//! Flag for this argument.
		Char flag,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< Arg, details::Deleter< ArgIface > > (
			new Arg( flag, isWithValue, isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			arg->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return *this;
	}